

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O3

int mp_init_size(mp_int *a,int size)

{
  int iVar1;
  mp_digit *__s;
  int iVar2;
  uint uVar3;
  
  uVar3 = size + 0x1f;
  if (-1 < size) {
    uVar3 = size;
  }
  iVar1 = (uVar3 & 0xffffffe0) + 0x40;
  __s = (mp_digit *)malloc((long)iVar1 << 3);
  a->dp = __s;
  if (__s == (mp_digit *)0x0) {
    iVar2 = -2;
  }
  else {
    iVar2 = 0;
    a->used = 0;
    a->alloc = iVar1;
    a->sign = 0;
    if (0 < iVar1) {
      iVar2 = 0;
      memset(__s,0,(ulong)((size - size % 0x20) + 0x3f) * 8 + 8);
    }
  }
  return iVar2;
}

Assistant:

int mp_init_size (mp_int * a, int size)
{
  int x;

  /* pad size so there are always extra digits */
  size += (MP_PREC * 2) - (size % MP_PREC);	
  
  /* alloc mem */
  a->dp = OPT_CAST(mp_digit) XMALLOC (sizeof (mp_digit) * size);
  if (a->dp == NULL) {
    return MP_MEM;
  }

  /* set the members */
  a->used  = 0;
  a->alloc = size;
  a->sign  = MP_ZPOS;

  /* zero the digits */
  for (x = 0; x < size; x++) {
      a->dp[x] = 0;
  }

  return MP_OKAY;
}